

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

void __thiscall UDMFParser::ParseThing(UDMFParser *this,FMapThing *th)

{
  int *piVar1;
  uint uVar2;
  double dVar3;
  char *__s2;
  byte bVar4;
  char cVar5;
  FMapThingUserData *pFVar6;
  int *piVar7;
  Node *pNVar8;
  bool bVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  FDoomEdEntry *pFVar13;
  Node *pNVar14;
  FString *this_00;
  long lVar15;
  FString arg1str;
  FString arg0str;
  maplinedef_t mld;
  FName key;
  FString local_f8;
  FString local_f0;
  int *local_e8;
  DWORD *local_e0;
  maplinedef_t local_d6;
  int local_c8;
  int local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  int local_8c;
  
  local_f0.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_f8.Chars = FString::NullString.Nothing;
  memset(th,0,0x90);
  th->RenderStyle = 0xe;
  th->FloatbobPhase = -1;
  th->Gravity = 1.0;
  th->Alpha = -1.0;
  th->health = 1;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  local_e0 = &th->flags;
  local_e8 = th->args;
  piVar1 = &th->special;
switchD_0057b98d_caseD_1:
  bVar9 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar9) {
    if (((ulong)((FNullStringData *)(local_f0.Chars + -0xc))->Len != 0) &&
       (((iVar11 = *piVar1, iVar11 - 0x50U < 6 || (iVar11 == 0xe2)) || (iVar11 == 0)))) {
      iVar11 = FName::NameManager::FindName
                         (&FName::NameData,local_f0.Chars,
                          (ulong)((FNullStringData *)(local_f0.Chars + -0xc))->Len,false);
      *local_e8 = -iVar11;
    }
    if ((ulong)((FNullStringData *)(local_f8.Chars + -0xc))->Len != 0) {
      uVar2 = *piVar1 - 0x86;
      if (((uVar2 < 0x2d) && ((0x12000000002fU >> ((ulong)uVar2 & 0x3f) & 1) != 0)) ||
         (*piVar1 == 0)) {
        iVar11 = FName::NameManager::FindName
                           (&FName::NameData,local_f8.Chars,
                            (ulong)((FNullStringData *)(local_f8.Chars + -0xc))->Len,false);
        th->args[1] = -iVar11;
      }
    }
    piVar7 = local_e8;
    if ((this->super_UDMFParserBase).namespc.Index == 0x17e) {
      if (*piVar1 != 0) {
        local_d6.flags = 0;
        local_d6.special = (short)*piVar1;
        local_d6.tag = (short)*local_e8;
        P_TranslateLineDef((line_t *)&stack0xffffffffffffff38,&local_d6,-1);
        *piVar1 = local_a0;
        piVar7[4] = local_8c;
        *(undefined8 *)piVar7 = local_9c;
        *(undefined8 *)(piVar7 + 2) = uStack_94;
      }
    }
    else if (this->isTranslated == true) {
      th->special = 0;
      th->args[0] = 0;
      th->args[1] = 0;
      th->args[2] = 0;
      th->args[3] = 0;
      th->args[4] = 0;
    }
    FString::~FString(&local_f8);
    FString::~FString(&local_f0);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&stack0xffffffffffffff38,SUB81(this,0),(bool *)0x0);
  iVar11 = local_c8;
  lVar15 = (long)local_c8;
  if (0x18d < lVar15) {
    if (local_c8 == 0x18e) {
      if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
        if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Floating point value expected for key \'%s\'",
                     FName::NameData.NameArray[0x18e].Text);
        }
        th->Gravity = (this->super_UDMFParserBase).sc.Float;
      }
    }
    else if (local_c8 == 0x1b2) {
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x1b2].Text);
      }
      iVar11 = FName::NameManager::FindName
                         (&FName::NameData,(this->super_UDMFParserBase).parsedString.Chars,false);
      switch(iVar11) {
      case 0:
        th->RenderStyle = 0;
        break;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x14:
      case 0x16:
        break;
      case 0x13:
      case 0x1c:
        th->RenderStyle = 7;
        break;
      case 0x15:
        th->RenderStyle = 2;
        break;
      case 0x17:
        th->RenderStyle = 5;
        break;
      case 0x18:
        th->RenderStyle = 0xc;
        break;
      case 0x19:
        th->RenderStyle = 1;
        break;
      case 0x1a:
        th->RenderStyle = 3;
        break;
      case 0x1b:
        th->RenderStyle = 4;
        break;
      case 0x1d:
        th->RenderStyle = 8;
        break;
      case 0x1e:
        th->RenderStyle = 0xd;
        break;
      case 0x1f:
        th->RenderStyle = 9;
        break;
      case 0x20:
        th->RenderStyle = 10;
        break;
      case 0x21:
      case 0x22:
        th->RenderStyle = 0xb;
        break;
      default:
        if (iVar11 == 0x14d) {
          th->RenderStyle = 6;
        }
      }
    }
    else {
switchD_0057b7e5_caseD_e1:
      if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
        __s2 = FName::NameData.NameArray[lVar15].Text;
        iVar12 = strncasecmp("user_",__s2,5);
        if (iVar12 == 0) {
          if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
            FScanner::ScriptMessage((FScanner *)this,"Integer value expected for key \'%s\'",__s2);
          }
          iVar12 = (this->super_UDMFParserBase).sc.Number;
          TArray<FMapThingUserData,_FMapThingUserData>::Grow(&MapThingsUserData,1);
          pFVar6 = MapThingsUserData.Array;
          MapThingsUserData.Array[MapThingsUserData.Count].Property.Index = iVar11;
          pFVar6[MapThingsUserData.Count].Value = iVar12;
          MapThingsUserData.Count = MapThingsUserData.Count + 1;
        }
      }
    }
    goto switchD_0057b98d_caseD_1;
  }
  cVar5 = (char)local_c8;
  switch(local_c8) {
  case 0xdf:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0xdf].Text);
    }
    th->Alpha = (this->super_UDMFParserBase).sc.Float;
    goto switchD_0057b98d_caseD_1;
  case 0xe0:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0xe0].Text);
    }
    th->angle = (short)(this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x109:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x117:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
  case 0x11d:
  case 0x11e:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x135:
  case 0x136:
  case 0x139:
  case 0x159:
  case 0x15a:
  case 0x15b:
  case 0x15c:
  case 0x15d:
  case 0x15e:
  case 0x15f:
  case 0x160:
  case 0x161:
  case 0x162:
  case 0x163:
  case 0x164:
  case 0x165:
  case 0x166:
  case 0x167:
  case 0x168:
  case 0x169:
  case 0x16a:
  case 0x16b:
  case 0x16c:
  case 0x16d:
  case 0x16e:
  case 0x16f:
    goto switchD_0057b7e5_caseD_e1;
  case 0xe4:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0xe4].Text);
    }
    th->health = (this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  case 0xe5:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0xe5].Text);
    }
    th->pitch = (short)(this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  case 0xe6:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) != 0) {
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0xe6].Text);
      }
      *piVar1 = (this->super_UDMFParserBase).sc.Number;
    }
    goto switchD_0057b98d_caseD_1;
  case 0xea:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0xea].Text);
    }
    (th->pos).X = (this->super_UDMFParserBase).sc.Float;
    goto switchD_0057b98d_caseD_1;
  case 0xeb:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0xeb].Text);
    }
    (th->pos).Y = (this->super_UDMFParserBase).sc.Float;
    goto switchD_0057b98d_caseD_1;
  case 0x10a:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0x10a].Text);
    }
    (th->pos).Z = (this->super_UDMFParserBase).sc.Float;
    goto switchD_0057b98d_caseD_1;
  case 0x10b:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0x10b].Text);
    }
    sVar10 = (short)(this->super_UDMFParserBase).sc.Number;
    th->EdNum = sVar10;
    pNVar8 = DoomEdMap.Nodes + (DoomEdMap.Size - 1 & (int)sVar10);
    do {
      pNVar14 = pNVar8;
      if ((pNVar14 == (Node *)0x0) || (pNVar14->Next == (Node *)0x1)) {
        pNVar14 = (Node *)0x0;
        break;
      }
      pNVar8 = pNVar14->Next;
    } while ((pNVar14->Pair).Key != (int)sVar10);
    pFVar13 = &(pNVar14->Pair).Value;
    if (pNVar14 == (Node *)0x0) {
      pFVar13 = (FDoomEdEntry *)0x0;
    }
    th->info = pFVar13;
    goto switchD_0057b98d_caseD_1;
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x110:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) != 0) {
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar15].Text);
      }
      local_e8[iVar11 - 0x10c] = (this->super_UDMFParserBase).sc.Number;
    }
    goto switchD_0057b98d_caseD_1;
  case 0x111:
    if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
      this_00 = &local_f0;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x111].Text);
      }
      goto LAB_0057beb4;
    }
    goto switchD_0057b98d_caseD_1;
  case 0x112:
    if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
      this_00 = &local_f8;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[0x112].Text);
      }
LAB_0057beb4:
      FString::operator=(this_00,(this->super_UDMFParserBase).parsedString.Chars);
    }
    goto switchD_0057b98d_caseD_1;
  case 0x113:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0x113].Text);
    }
    th->thingid = (this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 0x12a:
  case 299:
  case 300:
  case 0x12d:
  case 0x12e:
  case 0x12f:
  case 0x130:
  case 0x131:
  case 0x132:
  case 0x133:
  case 0x134:
    iVar11 = (this->super_UDMFParserBase).sc.TokenType;
    if (iVar11 - 0x14bU < 2) {
      if (iVar11 == 0x14b) {
        th->SkillFilter = th->SkillFilter | (ushort)(1 << (cVar5 - 0x25U & 0x1f));
        goto switchD_0057b98d_caseD_1;
      }
    }
    else {
      FScanner::ScriptMessage
                ((FScanner *)this,"Boolean value expected for key \'%s\'",
                 FName::NameData.NameArray[lVar15].Text);
    }
    bVar4 = cVar5 - 0x25U & 0x1f;
    th->SkillFilter =
         th->SkillFilter & ((ushort)(-2 << bVar4) | (ushort)(0xfffffffe >> 0x20 - bVar4));
    goto switchD_0057b98d_caseD_1;
  case 0x137:
    iVar11 = 8;
    lVar15 = 0x1370;
    break;
  case 0x138:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x10;
    lVar15 = 0x1380;
    break;
  case 0x13a:
  case 0x13b:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x140:
  case 0x141:
  case 0x142:
  case 0x143:
  case 0x144:
  case 0x145:
  case 0x146:
  case 0x147:
  case 0x148:
  case 0x149:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) != 0) {
      iVar11 = (this->super_UDMFParserBase).sc.TokenType;
      if (iVar11 - 0x14bU < 2) {
        if (iVar11 == 0x14b) {
          th->ClassFilter = th->ClassFilter | (ushort)(1 << (cVar5 - 0x3aU & 0x1f));
          goto switchD_0057b98d_caseD_1;
        }
      }
      else {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Boolean value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar15].Text);
      }
      bVar4 = cVar5 - 0x3aU & 0x1f;
      th->ClassFilter =
           th->ClassFilter & ((ushort)(-2 << bVar4) | (ushort)(0xfffffffe >> 0x20 - bVar4));
    }
    goto switchD_0057b98d_caseD_1;
  case 0x14a:
    iVar11 = 0x100;
    lVar15 = 0x14a0;
    break;
  case 0x14b:
    iVar11 = 0x200;
    lVar15 = 0x14b0;
    break;
  case 0x14c:
    iVar11 = 0x400;
    lVar15 = 0x14c0;
    break;
  case 0x14d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x800;
    lVar15 = 0x14d0;
    break;
  case 0x14e:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x1000;
    lVar15 = 0x14e0;
    break;
  case 0x14f:
    if (((this->super_UDMFParserBase).namespace_bits & 0x71) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x2000;
    lVar15 = 0x14f0;
    break;
  case 0x150:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x2000;
    lVar15 = 0x1500;
    break;
  case 0x151:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x4000;
    lVar15 = 0x1510;
    break;
  case 0x152:
    if (((this->super_UDMFParserBase).namespace_bits & 0x70) == 0) goto switchD_0057b98d_caseD_1;
    iVar11 = 0x80000;
    lVar15 = 0x1520;
    break;
  case 0x153:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0x153].Text);
    }
    th->score = (this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  case 0x154:
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0x154].Text);
    }
    th->roll = (short)(this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  case 0x155:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0x155].Text);
    }
    dVar3 = (this->super_UDMFParserBase).sc.Float;
    (th->Scale).Y = dVar3;
    (th->Scale).X = dVar3;
    goto switchD_0057b98d_caseD_1;
  case 0x156:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0x156].Text);
    }
    (th->Scale).X = (this->super_UDMFParserBase).sc.Float;
    goto switchD_0057b98d_caseD_1;
  case 0x157:
    if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Floating point value expected for key \'%s\'",
                 FName::NameData.NameArray[0x157].Text);
    }
    (th->Scale).Y = (this->super_UDMFParserBase).sc.Float;
    goto switchD_0057b98d_caseD_1;
  case 0x158:
    if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x158].Text);
      }
      th->FloatbobPhase = (this->super_UDMFParserBase).sc.Number;
    }
    goto switchD_0057b98d_caseD_1;
  case 0x170:
    if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[0x170].Text);
      }
      th->Conversation = (this->super_UDMFParserBase).sc.Number;
    }
    goto switchD_0057b98d_caseD_1;
  default:
    if (local_c8 != 0x23) goto switchD_0057b7e5_caseD_e1;
    if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
      FScanner::ScriptMessage
                ((FScanner *)this,"Integer value expected for key \'%s\'",
                 FName::NameData.NameArray[0x23].Text);
    }
    th->fillcolor = (this->super_UDMFParserBase).sc.Number;
    goto switchD_0057b98d_caseD_1;
  }
  UDMFParserBase::Flag<unsigned_int>
            (&this->super_UDMFParserBase,local_e0,iVar11,
             *(char **)((long)&(FName::NameData.NameArray)->Text + lVar15));
  goto switchD_0057b98d_caseD_1;
}

Assistant:

void ParseThing(FMapThing *th)
	{
		FString arg0str, arg1str;

		memset(th, 0, sizeof(*th));
		th->Gravity = 1;
		th->RenderStyle = STYLE_Count;
		th->Alpha = -1;
		th->health = 1;
		th->FloatbobPhase = -1;
		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Id:
				th->thingid = CheckInt(key);
				break;

			case NAME_X:
				th->pos.X = CheckFloat(key);
				break;

			case NAME_Y:
				th->pos.Y = CheckFloat(key);
				break;

			case NAME_Height:
				th->pos.Z = CheckFloat(key);
				break;

			case NAME_Angle:
				th->angle = (short)CheckInt(key);
				break;

			case NAME_Type:
				th->EdNum = (short)CheckInt(key);
				th->info = DoomEdMap.CheckKey(th->EdNum);
				break;

			case NAME_Conversation:
				CHECK_N(Zd | Zdt)
				th->Conversation = CheckInt(key);
				break;

			case NAME_Special:
				CHECK_N(Hx | Zd | Zdt | Va)
				th->special = CheckInt(key);
				break;

			case NAME_Gravity:
				CHECK_N(Zd | Zdt)
				th->Gravity = CheckFloat(key);
				break;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				CHECK_N(Hx | Zd | Zdt | Va)
				th->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				break;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				break;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				break;

			case NAME_Skill1:
			case NAME_Skill2:
			case NAME_Skill3:
			case NAME_Skill4:
			case NAME_Skill5:
			case NAME_Skill6:
			case NAME_Skill7:
			case NAME_Skill8:
			case NAME_Skill9:
			case NAME_Skill10:
			case NAME_Skill11:
			case NAME_Skill12:
			case NAME_Skill13:
			case NAME_Skill14:
			case NAME_Skill15:
			case NAME_Skill16:
				if (CheckBool(key)) th->SkillFilter |= (1<<(int(key)-NAME_Skill1));
				else th->SkillFilter &= ~(1<<(int(key)-NAME_Skill1));
				break;

			case NAME_Class1:
			case NAME_Class2:
			case NAME_Class3:
			case NAME_Class4:
			case NAME_Class5:
			case NAME_Class6:
			case NAME_Class7:
			case NAME_Class8:
			case NAME_Class9:
			case NAME_Class10:
			case NAME_Class11:
			case NAME_Class12:
			case NAME_Class13:
			case NAME_Class14:
			case NAME_Class15:
			case NAME_Class16:
				CHECK_N(Hx | Zd | Zdt | Va)
				if (CheckBool(key)) th->ClassFilter |= (1<<(int(key)-NAME_Class1));
				else th->ClassFilter &= ~(1<<(int(key)-NAME_Class1));
				break;

			case NAME_Ambush:
				Flag(th->flags, MTF_AMBUSH, key); 
				break;

			case NAME_Dormant:
				CHECK_N(Hx | Zd | Zdt | Va)
				Flag(th->flags, MTF_DORMANT, key); 
				break;

			case NAME_Single:
				Flag(th->flags, MTF_SINGLE, key); 
				break;

			case NAME_Coop:
				Flag(th->flags, MTF_COOPERATIVE, key); 
				break;

			case NAME_Dm:
				Flag(th->flags, MTF_DEATHMATCH, key); 
				break;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_SHADOW, key); 
				break;

			case NAME_Invisible:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_ALTSHADOW, key); 
				break;

			case NAME_Friend:	// This maps to Strife's friendly flag
				CHECK_N(Dm | Zd | Zdt | Va)
				Flag(th->flags, MTF_FRIENDLY, key); 
				break;

			case NAME_Strifeally:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_FRIENDLY, key); 
				break;

			case NAME_Standing:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_STANDSTILL, key); 
				break;

			case NAME_Countsecret:
				CHECK_N(Zd | Zdt | Va)
				Flag(th->flags, MTF_SECRET, key); 
				break;

			case NAME_Floatbobphase:
				CHECK_N(Zd | Zdt)
				th->FloatbobPhase = CheckInt(key);
				break;

			case NAME_Renderstyle:
				{
				FName style = CheckString(key);
				switch (style)
				{
				case NAME_None:
					th->RenderStyle = STYLE_None;
					break;
				case NAME_Normal:
					th->RenderStyle = STYLE_Normal;
					break;
				case NAME_Fuzzy:
					th->RenderStyle = STYLE_Fuzzy;
					break;
				case NAME_SoulTrans:
					th->RenderStyle = STYLE_SoulTrans;
					break;
				case NAME_OptFuzzy:
					th->RenderStyle = STYLE_OptFuzzy;
					break;
				case NAME_Stencil:
					th->RenderStyle = STYLE_Stencil;
					break;
				case NAME_AddStencil:
					th->RenderStyle = STYLE_AddStencil;
					break;
				case NAME_Translucent:
					th->RenderStyle = STYLE_Translucent;
					break;
				case NAME_Add:
				case NAME_Additive:
					th->RenderStyle = STYLE_Add;
					break;
				case NAME_Shaded:
					th->RenderStyle = STYLE_Shaded;
					break;
				case NAME_AddShaded:
					th->RenderStyle = STYLE_AddShaded;
					break;
				case NAME_TranslucentStencil:
					th->RenderStyle = STYLE_TranslucentStencil;
					break;
				case NAME_Shadow:
					th->RenderStyle = STYLE_Shadow;
					break;
				case NAME_Subtract:
				case NAME_Subtractive:
					th->RenderStyle = STYLE_Subtract;
					break;
				default:
					break;
				}
				}
				break;

			case NAME_Alpha:
				th->Alpha = CheckFloat(key);
				break;

			case NAME_FillColor:
				th->fillcolor = CheckInt(key);
				break;

			case NAME_Health:
				th->health = CheckInt(key);
				break;

			case NAME_Score:
				th->score = CheckInt(key);
				break;

			case NAME_Pitch:
				th->pitch = (short)CheckInt(key);
				break;

			case NAME_Roll:
				th->roll = (short)CheckInt(key);
				break;

			case NAME_ScaleX:
				th->Scale.X = CheckFloat(key);
				break;

			case NAME_ScaleY:
				th->Scale.Y = CheckFloat(key);
				break;

			case NAME_Scale:
				th->Scale.X = th->Scale.Y = CheckFloat(key);
				break;

			default:
				CHECK_N(Zd | Zdt)
				if (0 == strnicmp("user_", key.GetChars(), 5))
				{ // Custom user key - Sets an actor's user variable directly
					FMapThingUserData ud;
					ud.Property = key;
					ud.Value = CheckInt(key);
					MapThingsUserData.Push(ud);
				}
				break;
			}
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(th->special) || th->special == 0))
		{
			th->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(th->special) || th->special == 0))
		{
			th->args[1] = -FName(arg1str);
		}
		// Thing specials are only valid in namespaces with Hexen-type specials
		// and in ZDoomTranslated - which will use the translator on them.
		if (namespc == NAME_ZDoomTranslated)
		{
			maplinedef_t mld;
			line_t ld;

			if (th->special != 0)	// if special is 0, keep the args (e.g. for bridge things)
			{
				// The trigger type is ignored here.
				mld.flags = 0;
				mld.special = th->special;
				mld.tag = th->args[0];
				P_TranslateLineDef(&ld, &mld);
				th->special = ld.special;
				memcpy(th->args, ld.args, sizeof (ld.args));
			}
		}
		else if (isTranslated)
		{
			th->special = 0;
			memset(th->args, 0, sizeof (th->args));
		}
	}